

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::DeleteFromAEL(Clipper *this,TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge **ppTVar3;
  
  pTVar1 = e->nextInAEL;
  pTVar2 = e->prevInAEL;
  if (((pTVar2 == (TEdge *)0x0) && (pTVar1 == (TEdge *)0x0)) && (this->m_ActiveEdges != e)) {
    return;
  }
  ppTVar3 = &pTVar2->nextInAEL;
  if (pTVar2 == (TEdge *)0x0) {
    ppTVar3 = &this->m_ActiveEdges;
  }
  *ppTVar3 = pTVar1;
  if (pTVar1 != (TEdge *)0x0) {
    pTVar1->prevInAEL = pTVar2;
  }
  e->nextInAEL = (TEdge *)0x0;
  e->prevInAEL = (TEdge *)0x0;
  return;
}

Assistant:

void Clipper::DeleteFromAEL(TEdge *e)
{
  TEdge* AelPrev = e->prevInAEL;
  TEdge* AelNext = e->nextInAEL;
  if(  !AelPrev &&  !AelNext && (e != m_ActiveEdges) ) return; //already deleted
  if( AelPrev ) AelPrev->nextInAEL = AelNext;
  else m_ActiveEdges = AelNext;
  if( AelNext ) AelNext->prevInAEL = AelPrev;
  e->nextInAEL = 0;
  e->prevInAEL = 0;
}